

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pEVar1;
  FuncDef *pFVar2;
  bool bVar3;
  byte bVar4;
  int p2;
  int iVar5;
  uint uVar6;
  int iVar7;
  Op *pOVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  AggInfo_func *pAVar14;
  
  if (0 < pAggInfo->nFunc) {
    p = pParse->pVdbe;
    pAVar14 = pAggInfo->aFunc;
    iVar12 = 0;
    do {
      if (pParse->nErr != 0) {
        return;
      }
      pEVar1 = (pAVar14->pFExpr->x).pList;
      if (-1 < pAVar14->iOBTab) {
        iVar7 = pEVar1->nExpr;
        p2 = sqlite3GetTempRange(pParse,iVar7);
        if (pAVar14->bOBPayload == '\0') {
          iVar13 = 0;
        }
        else {
          iVar13 = ((pAVar14->pFExpr->pLeft->x).pList)->nExpr + (uint)(pAVar14->bOBUnique == '\0');
        }
        iVar5 = sqlite3VdbeAddOp3(p,0x24,pAVar14->iOBTab,0,0);
        if (0 < iVar7) {
          iVar11 = iVar7;
          do {
            sqlite3VdbeAddOp3(p,0x5e,pAVar14->iOBTab,iVar13 + -1 + iVar11,p2 + -1 + iVar11);
            iVar10 = iVar11 + -1;
            bVar3 = 0 < iVar11;
            iVar11 = iVar10;
          } while (iVar10 != 0 && bVar3);
        }
        if (pAVar14->bUseSubtype != '\0') {
          if (pParse->nTempReg == '\0') {
            iVar11 = pParse->nMem + 1;
            pParse->nMem = iVar11;
          }
          else {
            bVar4 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar4;
            iVar11 = pParse->aTempReg[bVar4];
          }
          uVar6 = 0;
          if (pAVar14->bOBPayload == '\0') {
            uVar6 = (uint)(pAVar14->bOBUnique == '\0');
          }
          if (0 < iVar7) {
            iVar10 = uVar6 + iVar13 + iVar7 * 2;
            iVar13 = iVar7;
            do {
              iVar10 = iVar10 + -1;
              sqlite3VdbeAddOp3(p,0x5e,pAVar14->iOBTab,iVar10,iVar11);
              sqlite3VdbeAddOp3(p,0xb6,iVar11,iVar13 + p2 + -1,0);
              iVar9 = iVar13 + -1;
              bVar3 = 0 < iVar13;
              iVar13 = iVar9;
            } while (iVar9 != 0 && bVar3);
          }
          if (iVar11 != 0) {
            bVar4 = pParse->nTempReg;
            if ((ulong)bVar4 < 8) {
              pParse->nTempReg = bVar4 + 1;
              pParse->aTempReg[bVar4] = iVar11;
            }
          }
        }
        sqlite3VdbeAddOp3(p,0xa2,0,p2,pAggInfo->iFirstReg + iVar12 + pAggInfo->nColumn);
        pFVar2 = pAVar14->pFunc;
        if (p->db->mallocFailed == '\0') {
          pOVar8 = p->aOp;
          iVar13 = p->nOp;
          pOVar8[(long)iVar13 + -1].p4type = -7;
          pOVar8[(long)iVar13 + -1].p4.pKeyInfo = (KeyInfo *)pFVar2;
        }
        else if ((pFVar2->funcFlags & 0x10) != 0) {
          sqlite3DbNNFreeNN(p->db,pFVar2);
        }
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = (u16)iVar7;
        }
        sqlite3VdbeAddOp3(p,0x27,pAVar14->iOBTab,iVar5 + 1,0);
        pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          pOVar8 = p->aOp + iVar5;
        }
        pOVar8->p2 = p->nOp;
        if (iVar7 == 1) {
          if (p2 != 0) {
            bVar4 = pParse->nTempReg;
            if ((ulong)bVar4 < 8) {
              pParse->nTempReg = bVar4 + 1;
              pParse->aTempReg[bVar4] = p2;
            }
          }
        }
        else if (pParse->nRangeReg < iVar7) {
          pParse->nRangeReg = iVar7;
          pParse->iRangeReg = p2;
        }
      }
      if (pEVar1 == (ExprList *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = pEVar1->nExpr;
      }
      sqlite3VdbeAddOp3(p,0xa5,pAggInfo->iFirstReg + iVar12 + pAggInfo->nColumn,iVar7,0);
      pFVar2 = pAVar14->pFunc;
      if (p->db->mallocFailed == '\0') {
        pOVar8 = p->aOp;
        iVar7 = p->nOp;
        pOVar8[(long)iVar7 + -1].p4type = -7;
        pOVar8[(long)iVar7 + -1].p4.pKeyInfo = (KeyInfo *)pFVar2;
      }
      else if ((pFVar2->funcFlags & 0x10) != 0) {
        sqlite3DbNNFreeNN(p->db,pFVar2);
      }
      iVar12 = iVar12 + 1;
      pAVar14 = pAVar14 + 1;
    } while (iVar12 < pAggInfo->nFunc);
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    if( pParse->nErr ) return;
    pList = pF->pFExpr->x.pList;
    if( pF->iOBTab>=0 ){
      /* For an ORDER BY aggregate, calls to OP_AggStep were deferred.  Inputs
      ** were stored in emphermal table pF->iOBTab.  Here, we extract those
      ** inputs (in ORDER BY order) and make all calls to OP_AggStep
      ** before doing the OP_AggFinal call. */
      int iTop;        /* Start of loop for extracting columns */
      int nArg;        /* Number of columns to extract */
      int nKey;        /* Key columns to be skipped */
      int regAgg;      /* Extract into this array */
      int j;           /* Loop counter */

      assert( pF->pFunc!=0 );
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);

      if( pF->bOBPayload==0 ){
        nKey = 0;
      }else{
        assert( pF->pFExpr->pLeft!=0 );
        assert( ExprUseXList(pF->pFExpr->pLeft) );
        assert( pF->pFExpr->pLeft->x.pList!=0 );
        nKey = pF->pFExpr->pLeft->x.pList->nExpr;
        if( ALWAYS(!pF->bOBUnique) ) nKey++;
      }
      iTop = sqlite3VdbeAddOp1(v, OP_Rewind, pF->iOBTab); VdbeCoverage(v);
      for(j=nArg-1; j>=0; j--){
        sqlite3VdbeAddOp3(v, OP_Column, pF->iOBTab, nKey+j, regAgg+j);
      }
      if( pF->bUseSubtype ){
        int regSubtype = sqlite3GetTempReg(pParse);
        int iBaseCol = nKey + nArg + (pF->bOBPayload==0 && pF->bOBUnique==0);
        for(j=nArg-1; j>=0; j--){
          sqlite3VdbeAddOp3(v, OP_Column, pF->iOBTab, iBaseCol+j, regSubtype);
          sqlite3VdbeAddOp2(v, OP_SetSubtype, regSubtype, regAgg+j);
        }
        sqlite3ReleaseTempReg(pParse, regSubtype);
      }
      sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, AggInfoFuncReg(pAggInfo,i));
      sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      sqlite3VdbeAddOp2(v, OP_Next, pF->iOBTab, iTop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, iTop);
      sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    }
    sqlite3VdbeAddOp2(v, OP_AggFinal, AggInfoFuncReg(pAggInfo,i),
                      pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}